

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *this,iterator it,SnapshotDataType *t)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  size_type sVar2;
  size_type sVar3;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar4;
  SnapshotDataType *t_local;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *this_local;
  iterator it_local;
  
  it_local.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)it.Position;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar3 = std::
          vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
          ::size(&this->Data);
  pcVar1 = it_local.Tree;
  if (sVar2 != sVar3) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0xb5,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(iterator, T &&) [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  pcVar4 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  if (pcVar1 <= pcVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->UpPositions,(value_type_conflict1 *)&it_local);
    std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>::
    push_back(&this->Data,t);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
    iterator::iterator((iterator *)&it_local.Position,this,sVar2);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                ,0xb6,
                "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(iterator, T &&) [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }